

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_sector.cpp
# Opt level: O3

ON_SubDSectorType *
ON_SubDSectorType::CreateDartSectorType
          (ON_SubDSectorType *__return_storage_ptr__,uint sector_face_count)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  
  if ((1 < sector_face_count + 1) &&
     ((uVar2 = MinimumSectorFaceCount(Dart), 0xfff0 < sector_face_count ||
      (sector_face_count < uVar2)))) {
    ON_SubDIncrementErrorCount();
    __return_storage_ptr__->m_corner_sector_angle_radians = 0.0;
    __return_storage_ptr__->m_sector_coefficient = 0.0;
    __return_storage_ptr__->m_sector_theta = 0.0;
    __return_storage_ptr__->m_vertex_tag = Unset;
    __return_storage_ptr__->m_reserved1 = '\0';
    __return_storage_ptr__->m_reserved2 = 0;
    __return_storage_ptr__->m_hash = 0;
    __return_storage_ptr__->m_corner_sector_angle_index = 0;
    __return_storage_ptr__->m_sector_face_count = 0;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->m_vertex_tag = Unset;
  __return_storage_ptr__->m_reserved1 = '\0';
  __return_storage_ptr__->m_reserved2 = 0;
  __return_storage_ptr__->m_hash = 0;
  __return_storage_ptr__->m_corner_sector_angle_index = 0;
  __return_storage_ptr__->m_sector_face_count = 0;
  __return_storage_ptr__->m_sector_coefficient = 0.0;
  __return_storage_ptr__->m_sector_theta = 0.0;
  __return_storage_ptr__->m_corner_sector_angle_radians = 0.0;
  __return_storage_ptr__->m_vertex_tag = Dart;
  uVar3 = MinimumSectorFaceCount(Dart);
  uVar2 = 0;
  if (uVar3 <= sector_face_count) {
    uVar2 = sector_face_count;
  }
  if (0xfff0 < sector_face_count) {
    uVar2 = 0;
  }
  __return_storage_ptr__->m_sector_face_count = uVar2;
  if (uVar2 == 0) {
    __return_storage_ptr__->m_sector_coefficient = -8883.0;
    pdVar4 = &UnsetSectorTheta;
  }
  else {
    dVar1 = DartSectorCoefficient(sector_face_count);
    __return_storage_ptr__->m_sector_coefficient = dVar1;
    if (1 < sector_face_count) {
      dVar1 = 6.283185307179586 / (double)sector_face_count;
      goto LAB_0062b9d1;
    }
    ON_SubDIncrementErrorCount();
    pdVar4 = &ErrorSectorTheta;
  }
  dVar1 = *pdVar4;
LAB_0062b9d1:
  __return_storage_ptr__->m_sector_theta = dVar1;
  SetHash(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ON_SubDSectorType ON_SubDSectorType::CreateDartSectorType(
  unsigned int sector_face_count
  )
{
  const ON_SubDVertexTag vertex_tag = ON_SubDVertexTag::Dart;
  if ( ON_SubDSectorType_IsValidFaceCountForCreate(vertex_tag,sector_face_count) )
  {
    ON_SubDSectorType st;
    st.m_vertex_tag = vertex_tag;
    st.m_sector_face_count 
      = ON_SubDSectorType_IsValidFaceCount(vertex_tag,sector_face_count)
      ? sector_face_count
      : 0;
    st.m_sector_coefficient
      = (st.m_sector_face_count>0)
      ? ON_SubDSectorType::DartSectorCoefficient(sector_face_count)
      : ON_SubDSectorType::UnsetSectorCoefficient;
    st.m_sector_theta 
      = (st.m_sector_face_count>0)
      ? ON_SubDSectorType::DartSectorTheta(sector_face_count)
      : ON_SubDSectorType::UnsetSectorTheta;
    st.SetHash();
    return st;
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::Empty);
}